

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rayfork.c
# Opt level: O1

rf_materials_array
rf_load_materials_from_mtl(char *filename,rf_allocator allocator,rf_io_callbacks io)

{
  long lVar1;
  long lVar2;
  long *in_FS_OFFSET;
  
  if (filename != (char *)0x0) {
    lVar1 = *in_FS_OFFSET;
    in_FS_OFFSET[-0x86] = (long)allocator.user_data;
    in_FS_OFFSET[-0x85] = (long)allocator.allocator_proc;
    *(undefined4 *)(in_FS_OFFSET + -0x84) = io.user_data._0_4_;
    *(undefined4 *)((long)in_FS_OFFSET + -0x41c) = io.user_data._4_4_;
    *(undefined4 *)(in_FS_OFFSET + -0x83) = io.file_size_proc._0_4_;
    *(undefined4 *)((long)in_FS_OFFSET + -0x414) = io.file_size_proc._4_4_;
    in_FS_OFFSET[-0x82] = (long)io.read_file_proc;
    lVar2 = (*(code *)in_FS_OFFSET[-0x83])(in_FS_OFFSET[-0x84],filename);
    if (lVar2 != 0) {
      (*(code *)in_FS_OFFSET[-0x82])(in_FS_OFFSET[-0x84],filename,0,lVar2);
    }
    *(undefined8 *)(lVar1 + -0x420) = 0;
    *(undefined8 *)(lVar1 + -0x418) = 0;
    *(undefined8 *)(lVar1 + -0x410) = 0;
    *(undefined8 *)(lVar1 + -0x430) = 0;
    *(undefined8 *)(lVar1 + -0x428) = 0;
  }
  return (rf_materials_array)ZEXT816(0);
}

Assistant:

RF_API rf_materials_array rf_load_materials_from_mtl(const char* filename, rf_allocator allocator, rf_io_callbacks io)
{
    if (!filename) return (rf_materials_array) {0};

    rf_materials_array result = {0};

    RF_SET_GLOBAL_DEPENDENCIES_ALLOCATOR(allocator);
    RF_SET_TINYOBJ_IO_CALLBACKS(io);
    {
        size_t size = 0;
        tinyobj_material_t* mats = 0;
        if (tinyobj_parse_mtl_file(&mats, (size_t*) &size, filename, rf_tinyobj_file_reader_callback) != TINYOBJ_SUCCESS)
        {
            // Log Error
        }
        tinyobj_materials_free(mats, result.size);

        result.size = size;
    }
    RF_SET_TINYOBJ_IO_CALLBACKS(RF_NULL_IO);
    RF_SET_GLOBAL_DEPENDENCIES_ALLOCATOR(RF_NULL_ALLOCATOR);

    // Set materials shader to default (DIFFUSE, SPECULAR, NORMAL)
    for (rf_int i = 0; i < result.size; i++)
    {
        result.materials[i].shader = rf_get_default_shader();
    }

    return result;
}